

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAabbUtil2.h
# Opt level: O2

int cbtOutcode(cbtVector3 *p,cbtVector3 *halfExtent)

{
  ulong uVar1;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar2 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)halfExtent->m_floats;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)p->m_floats;
  auVar5._0_8_ = *(ulong *)(halfExtent->m_floats + 1) ^ 0x8000000080000000;
  auVar5._8_4_ = 0x80000000;
  auVar5._12_4_ = 0x80000000;
  auVar3 = vmovlhps_avx(auVar2,auVar5);
  auVar2 = vinsertps_avx(auVar4,auVar2,0x68);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)p->m_floats[2]),0x30);
  uVar1 = vcmpps_avx512vl(auVar2,auVar3,1);
  auVar2 = vmovdqa32_avx512vl(_DAT_00f5dad0);
  auVar3._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * auVar2._4_4_;
  auVar3._0_4_ = (uint)((byte)uVar1 & 1) * auVar2._0_4_;
  auVar3._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * auVar2._8_4_;
  auVar3._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * auVar2._12_4_;
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpor_avx(auVar3,auVar2);
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar2 = vpor_avx(auVar2,auVar3);
  return auVar2._0_4_ |
         (uint)(halfExtent->m_floats[2] < p->m_floats[2]) << 5 |
         (uint)((float)*(ulong *)p->m_floats < -(float)*(ulong *)halfExtent->m_floats);
}

Assistant:

SIMD_FORCE_INLINE int cbtOutcode(const cbtVector3& p, const cbtVector3& halfExtent)
{
	return (p.getX() < -halfExtent.getX() ? 0x01 : 0x0) |
		   (p.getX() > halfExtent.getX() ? 0x08 : 0x0) |
		   (p.getY() < -halfExtent.getY() ? 0x02 : 0x0) |
		   (p.getY() > halfExtent.getY() ? 0x10 : 0x0) |
		   (p.getZ() < -halfExtent.getZ() ? 0x4 : 0x0) |
		   (p.getZ() > halfExtent.getZ() ? 0x20 : 0x0);
}